

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::convert_row_major_matrix
          (string *__return_storage_ptr__,CompilerGLSL *this,string *exp_str,SPIRType *exp_type,
          uint32_t param_3,bool param_4,bool relaxed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer pcVar4;
  bool bVar5;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  CompilerError *this_00;
  uint uVar9;
  size_type *psVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined4 in_register_00000084;
  char (*ts_2) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined1 local_b9;
  string local_b8;
  uint local_98;
  undefined4 uStack_94;
  long local_90;
  ulong local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_58;
  long local_50;
  char local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  ts_2 = (char (*) [2])CONCAT44(in_register_00000084,param_3);
  strip_enclosed_expression((CompilerGLSL *)__return_storage_ptr__,exp_str);
  bVar5 = Compiler::is_matrix(&this->super_Compiler,exp_type);
  if (bVar5) {
    if (0x77 < (this->options).version) {
      join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x2c9306,(char (*) [11])exp_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,ts_2)
      ;
      return __return_storage_ptr__;
    }
    uVar2 = exp_type->vecsize;
    uVar3 = exp_type->columns;
    if (uVar3 == 2 && uVar2 == 2) {
      if ((!relaxed) ||
         ((lVar6 = 0x24d0, (this->options).es == false &&
          ((this->options).vulkan_semantics == false)))) {
        lVar6 = 0x24cc;
      }
      uVar9 = *(uint *)((this->super_Compiler).ir.ids.stack_storage.aligned_char + lVar6 + -0x40);
      if ((uVar9 & 1) != 0) goto LAB_00165fa5;
      uVar9 = uVar9 | 1;
    }
    else if (uVar3 == 3 && uVar2 == 3) {
      if ((!relaxed) ||
         ((lVar6 = 0x24d0, (this->options).es == false &&
          ((this->options).vulkan_semantics == false)))) {
        lVar6 = 0x24cc;
      }
      uVar9 = *(uint *)((this->super_Compiler).ir.ids.stack_storage.aligned_char + lVar6 + -0x40);
      if ((uVar9 & 2) != 0) goto LAB_00165fa5;
      uVar9 = uVar9 | 2;
    }
    else {
      if ((uVar2 != 4) || (uVar3 != 4)) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,"Non-square matrices are not supported in legacy GLSL, cannot transpose."
                  );
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((!relaxed) ||
         ((lVar6 = 0x24d0, (this->options).es == false &&
          ((this->options).vulkan_semantics == false)))) {
        lVar6 = 0x24cc;
      }
      uVar9 = *(uint *)((this->super_Compiler).ir.ids.stack_storage.aligned_char + lVar6 + -0x40);
      if ((uVar9 & 4) != 0) goto LAB_00165fa5;
      uVar9 = uVar9 | 4;
    }
    *(uint *)((this->super_Compiler).ir.ids.stack_storage.aligned_char + lVar6 + -0x40) = uVar9;
    Compiler::force_recompile(&this->super_Compiler);
LAB_00165fa5:
    local_58 = "MP";
    if (!relaxed) {
      local_58 = "";
    }
    if ((this->options).es == false) {
      local_58 = "";
    }
    join<char_const(&)[13],char_const*,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x2b7e50,(char (*) [13])&local_58,
               (char **)0x2d522e,(char (*) [2])exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,
               (char (*) [2])in_stack_ffffffffffffff38);
    return __return_storage_ptr__;
  }
  lVar6 = ::std::__cxx11::string::rfind((char)exp_str,0x5b);
  if (lVar6 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (exp_str->_M_dataplus)._M_p;
    paVar1 = &exp_str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar1) {
      uVar12 = *(undefined8 *)((long)&exp_str->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar12;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = exp_str->_M_string_length;
    (exp_str->_M_dataplus)._M_p = (pointer)paVar1;
    exp_str->_M_string_length = 0;
    (exp_str->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::substr((ulong)&local_58,(ulong)exp_str);
  ::std::__cxx11::string::resize((ulong)exp_str,(char)lVar6);
  lVar6 = ::std::__cxx11::string::rfind((char)&local_58,0x5d);
  if ((lVar6 == -1) || (lVar6 + 1 == local_50)) goto LAB_0016608d;
  ::std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_58);
  ::std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_58);
  uVar11 = 0xf;
  if ((ulong *)CONCAT44(uStack_94,local_98) != local_88) {
    uVar11 = local_88[0];
  }
  if (uVar11 < local_78._M_string_length + local_90) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
        &local_78.field_2) {
      uVar12 = local_78.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_78._M_string_length + local_90) goto LAB_00165ea3;
    puVar7 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)&local_78,0,(char *)0x0,CONCAT44(uStack_94,local_98));
  }
  else {
LAB_00165ea3:
    puVar7 = (undefined8 *)
             ::std::__cxx11::string::_M_append
                       ((char *)&local_98,
                        CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_));
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar10 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_b8.field_2._M_allocated_capacity = *psVar10;
    local_b8.field_2._8_8_ = puVar7[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar10;
    local_b8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_b8._M_string_length = puVar7[1];
  *puVar7 = psVar10;
  puVar7[1] = 0;
  *(undefined1 *)psVar10 = 0;
  ::std::__cxx11::string::operator=((string *)&local_58,(string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
      &local_78.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_));
  }
  if ((ulong *)CONCAT44(uStack_94,local_98) != local_88) {
    operator_delete((ulong *)CONCAT44(uStack_94,local_98));
  }
LAB_0016608d:
  type_to_glsl_constructor_abi_cxx11_(&local_b8,this,exp_type);
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_b8);
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    lVar6 = plVar8[3];
    local_38->_M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  local_98 = 0;
  if (exp_type->vecsize != 0) {
    do {
      local_78._M_dataplus._M_p._0_1_ = 0x5b;
      local_b9 = 0x5d;
      join<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
                (&local_b8,(spirv_cross *)exp_str,&local_78,(char *)&local_98,(uint *)&local_b9,
                 (char *)&local_58,in_stack_ffffffffffffff38);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if (local_98 + 1 < exp_type->vecsize) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      local_98 = local_98 + 1;
    } while (local_98 < exp_type->vecsize);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t /* physical_type_id */,
                                              bool /*is_packed*/, bool relaxed)
{
	strip_enclosed_expression(exp_str);
	if (!is_matrix(exp_type))
	{
		auto column_index = exp_str.find_last_of('[');
		if (column_index == string::npos)
			return exp_str;

		auto column_expr = exp_str.substr(column_index);
		exp_str.resize(column_index);

		auto end_deferred_index = column_expr.find_last_of(']');
		if (end_deferred_index != string::npos && end_deferred_index + 1 != column_expr.size())
		{
			// If we have any data member fixups, it must be transposed so that it refers to this index.
			// E.g. [0].data followed by [1] would be shuffled to [1][0].data which is wrong,
			// and needs to be [1].data[0] instead.
			end_deferred_index++;
			column_expr = column_expr.substr(end_deferred_index) +
			              column_expr.substr(0, end_deferred_index);
		}

		auto transposed_expr = type_to_glsl_constructor(exp_type) + "(";

		// Loading a column from a row-major matrix. Unroll the load.
		for (uint32_t c = 0; c < exp_type.vecsize; c++)
		{
			transposed_expr += join(exp_str, '[', c, ']', column_expr);
			if (c + 1 < exp_type.vecsize)
				transposed_expr += ", ";
		}

		transposed_expr += ")";
		return transposed_expr;
	}
	else if (options.version < 120)
	{
		// GLSL 110, ES 100 do not have transpose(), so emulate it.  Note that
		// these GLSL versions do not support non-square matrices.
		if (exp_type.vecsize == 2 && exp_type.columns == 2)
			require_polyfill(PolyfillTranspose2x2, relaxed);
		else if (exp_type.vecsize == 3 && exp_type.columns == 3)
			require_polyfill(PolyfillTranspose3x3, relaxed);
		else if (exp_type.vecsize == 4 && exp_type.columns == 4)
			require_polyfill(PolyfillTranspose4x4, relaxed);
		else
			SPIRV_CROSS_THROW("Non-square matrices are not supported in legacy GLSL, cannot transpose.");
		return join("spvTranspose", (options.es && relaxed) ? "MP" : "", "(", exp_str, ")");
	}
	else
		return join("transpose(", exp_str, ")");
}